

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex.cc
# Opt level: O3

ostream * fizplex::operator<<(ostream *os,IterationDecision *id)

{
  int iVar1;
  mapped_type *pmVar2;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined1 local_15f;
  undefined1 local_15e;
  undefined1 local_15d;
  IterationDecision local_15c [7];
  pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  
  if (operator<<(std::ostream&,fizplex::Simplex::IterationDecision_const&)::idtos_abi_cxx11_ == '\0'
     ) {
    iVar1 = __cxa_guard_acquire(&operator<<(std::ostream&,fizplex::Simplex::IterationDecision_const&)
                                 ::idtos_abi_cxx11_);
    if (iVar1 != 0) {
      local_15c[6] = 0;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[10],_true>
                (&local_140,local_15c + 6,(char (*) [10])0x19f15e);
      local_15c[5] = 1;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[10],_true>
                (&local_118,local_15c + 5,(char (*) [10])0x19f1ac);
      local_15c[4] = 2;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[11],_true>
                (&local_f0,local_15c + 4,(char (*) [11])0x19f1f5);
      local_15c[3] = 3;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[16],_true>
                (&local_c8,local_15c + 3,(char (*) [16])0x19d78c);
      local_15c[2] = 4;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[17],_true>
                (&local_a0,local_15c + 2,(char (*) [17])"SwitchToPhaseTwo");
      local_15c[1] = 5;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[11],_true>
                (&local_78,local_15c + 1,(char (*) [11])0x19d95e);
      local_15c[0] = Unfinished;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[11],_true>
                (&local_50,local_15c,(char (*) [11])"Unfinished");
      std::
      _Hashtable<fizplex::Simplex::IterationDecision,std::pair<fizplex::Simplex::IterationDecision_const,std::__cxx11::string>,std::allocator<std::pair<fizplex::Simplex::IterationDecision_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<fizplex::Simplex::IterationDecision>,std::hash<fizplex::Simplex::IterationDecision>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_Hashtable<std::pair<fizplex::Simplex::IterationDecision_const,std::__cxx11::string>const*>
                ((_Hashtable<fizplex::Simplex::IterationDecision,std::pair<fizplex::Simplex::IterationDecision_const,std::__cxx11::string>,std::allocator<std::pair<fizplex::Simplex::IterationDecision_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<fizplex::Simplex::IterationDecision>,std::hash<fizplex::Simplex::IterationDecision>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&operator<<(std::ostream&,fizplex::Simplex::IterationDecision_const&)::
                     idtos_abi_cxx11_,&local_140,&stack0xffffffffffffffd8,0,&local_15d,&local_15e,
                 &local_15f);
      lVar3 = -0x118;
      paVar4 = &local_50.second.field_2;
      do {
        if (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar4->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar4->_M_allocated_capacity)[-2],
                          paVar4->_M_allocated_capacity + 1);
        }
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar4->_M_allocated_capacity + -5);
        lVar3 = lVar3 + 0x28;
      } while (lVar3 != 0);
      __cxa_atexit(std::
                   unordered_map<fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<fizplex::Simplex::IterationDecision>,_std::equal_to<fizplex::Simplex::IterationDecision>,_std::allocator<std::pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,
                   &operator<<(std::ostream&,fizplex::Simplex::IterationDecision_const&)::
                    idtos_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&operator<<(std::ostream&,fizplex::Simplex::IterationDecision_const&)::
                           idtos_abi_cxx11_);
    }
  }
  pmVar2 = std::__detail::
           _Map_base<fizplex::Simplex::IterationDecision,_std::pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<fizplex::Simplex::IterationDecision>,_std::hash<fizplex::Simplex::IterationDecision>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<fizplex::Simplex::IterationDecision,_std::pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<fizplex::Simplex::IterationDecision>,_std::hash<fizplex::Simplex::IterationDecision>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&operator<<(std::ostream&,fizplex::Simplex::IterationDecision_const&)::
                            idtos_abi_cxx11_,id);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os,
                         const Simplex::IterationDecision &id) {
  static std::unordered_map<Simplex::IterationDecision, std::string> idtos = {
      {Simplex::IterationDecision::Unbounded, "Unbounded"},
      {Simplex::IterationDecision::BoundFlip, "BoundFlip"},
      {Simplex::IterationDecision::BaseChange, "BaseChange"},
      {Simplex::IterationDecision::OptimalSolution, "OptimalSolution"},
      {Simplex::IterationDecision::SwitchToPhaseTwo, "SwitchToPhaseTwo"},
      {Simplex::IterationDecision::Infeasible, "Infeasible"},
      {Simplex::IterationDecision::Unfinished, "Unfinished"}};
  os << idtos[id];
  return os;
}